

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O3

void Tim_ManPrintStats(Tim_Man_t *p,int nAnd2Delay)

{
  int *piVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  void *pvVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  void *__s;
  void *__s_00;
  ulong uVar9;
  undefined4 in_register_00000034;
  long lVar10;
  size_t __size;
  uint uVar11;
  ulong uVar12;
  
  if (p != (Tim_Man_t *)0x0) {
    Abc_Print((int)p,(char *)CONCAT44(in_register_00000034,nAnd2Delay));
    if ((p->vBoxes == (Vec_Ptr_t *)0x0) || (p->vBoxes->nSize == 0)) {
      uVar6 = p->nCis;
      uVar11 = uVar6;
    }
    else {
      uVar6 = Tim_ManBoxOutputFirst(p,0);
      uVar11 = p->nCis;
    }
    uVar7 = Tim_ManPoNum(p);
    if (p->vBoxes == (Vec_Ptr_t *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)(uint)p->vBoxes->nSize;
    }
    printf("PI/CI = %d/%d   PO/CO = %d/%d   Box = %d   ",(ulong)uVar6,(ulong)uVar11,(ulong)uVar7,
           (ulong)(uint)p->nCos,uVar12);
    if (nAnd2Delay != 0) {
      printf("delay(AND2) = %d");
    }
    putchar(10);
    pVVar3 = p->vBoxes;
    if (pVVar3 != (Vec_Ptr_t *)0x0) {
      uVar6 = pVVar3->nSize;
      uVar12 = (ulong)uVar6;
      if (uVar12 != 0) {
        if ((int)uVar6 < 1) {
          __size = 0x40;
          uVar7 = 0;
          uVar11 = 1;
        }
        else {
          uVar9 = 0;
          uVar7 = 0;
          do {
            uVar11 = *(uint *)((long)pVVar3->pArray[uVar9] + 0x10);
            if ((int)uVar11 < (int)uVar7) {
              uVar11 = uVar7;
            }
            uVar7 = uVar11;
            uVar9 = uVar9 + 1;
          } while (uVar12 != uVar9);
          uVar11 = uVar7 + 1;
          uVar8 = 0x10;
          if (0xe < uVar7) {
            uVar8 = uVar11;
          }
          __size = (long)(int)uVar8 << 2;
        }
        __s = malloc(__size);
        memset(__s,0,(long)(int)uVar11 * 4);
        uVar8 = 8;
        if (6 < uVar7) {
          uVar8 = uVar11;
        }
        __s_00 = malloc((long)(int)uVar8 << 3);
        memset(__s_00,0,(long)(int)uVar11 << 3);
        if (0 < (int)uVar6) {
          ppvVar4 = pVVar3->pArray;
          uVar9 = 0;
          do {
            pvVar5 = ppvVar4[uVar9];
            iVar2 = *(int *)((long)pvVar5 + 0x10);
            lVar10 = (long)iVar2;
            if ((lVar10 < 0) || ((int)uVar7 < iVar2)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
            }
            piVar1 = (int *)((long)__s + lVar10 * 4);
            *piVar1 = *piVar1 + 1;
            *(void **)((long)__s_00 + lVar10 * 8) = pvVar5;
            uVar9 = uVar9 + 1;
          } while (uVar9 < uVar12);
        }
        uVar12 = 0;
        do {
          uVar6 = *(uint *)((long)__s + uVar12 * 4);
          if (uVar6 != 0) {
            lVar10 = *(long *)((long)__s_00 + uVar12 * 8);
            printf("    Box %4d      ",uVar12 & 0xffffffff);
            printf("Num = %4d   ",(ulong)uVar6);
            printf("Ins = %4d   ",(ulong)*(uint *)(lVar10 + 8));
            printf("Outs = %4d",(ulong)*(uint *)(lVar10 + 0xc));
            putchar(10);
          }
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
        free(__s);
        if (__s_00 != (void *)0x0) {
          free(__s_00);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void Tim_ManPrintStats( Tim_Man_t * p, int nAnd2Delay )
{
    Tim_Box_t * pBox;
    Vec_Int_t * vCounts;
    Vec_Ptr_t * vBoxes;
    int i, Count, IdMax;
    if ( p == NULL )
        return;
    Abc_Print( 1, "Hierarchy      :  " );
    printf( "PI/CI = %d/%d   PO/CO = %d/%d   Box = %d   ", 
        Tim_ManPiNum(p), Tim_ManCiNum(p), 
        Tim_ManPoNum(p), Tim_ManCoNum(p), 
        Tim_ManBoxNum(p) );
    if ( nAnd2Delay )
        printf( "delay(AND2) = %d", nAnd2Delay );
    printf( "\n" );
    if ( Tim_ManBoxNum(p) == 0 )
        return;
    IdMax = 0;
    Tim_ManForEachBox( p, pBox, i )
        IdMax = Abc_MaxInt( IdMax, pBox->iDelayTable );
    vCounts = Vec_IntStart( IdMax+1 );
    vBoxes  = Vec_PtrStart( IdMax+1 );
    Tim_ManForEachBox( p, pBox, i )
    {
        Vec_IntAddToEntry( vCounts, pBox->iDelayTable, 1 );
        Vec_PtrWriteEntry( vBoxes, pBox->iDelayTable, pBox );
    }
    // print statistics about boxes
    Vec_IntForEachEntry( vCounts, Count, i )
    {
        if ( Count == 0 ) continue;
        pBox = (Tim_Box_t *)Vec_PtrEntry( vBoxes, i );
        printf( "    Box %4d      ", i );
        printf( "Num = %4d   ", Count );
        printf( "Ins = %4d   ", pBox->nInputs );
        printf( "Outs = %4d",   pBox->nOutputs );
        printf( "\n" );
    }
    Vec_IntFree( vCounts );
    Vec_PtrFree( vBoxes );
}